

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::ComputeNormals
          (LWOImporter *this,aiMesh *mesh,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups,Surface *surface)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  aiVector3D *paVar8;
  aiFace *face;
  aiVector3D *paVar9;
  aiFace *paVar10;
  pointer puVar11;
  ulong uVar12;
  aiFace *paVar13;
  uint *puVar14;
  uint *puVar15;
  aiFace *face_1;
  uint32_t *puVar16;
  uint *puVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint uVar25;
  uint uVar26;
  aiFace *face_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poResult;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  SGSpatialSort sSort;
  allocator_type local_d2;
  bool local_d1;
  aiFace *local_d0;
  ai_real local_c4;
  LWOImporter *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_98;
  vector<bool,_std::allocator<bool>_> local_80;
  SGSpatialSort local_58;
  
  uVar12 = (ulong)mesh->mNumVertices;
  local_d0 = (aiFace *)smoothingGroups;
  paVar9 = (aiVector3D *)operator_new__(uVar12 * 0xc);
  if (uVar12 != 0) {
    memset(paVar9,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  mesh->mNormals = paVar9;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3D *)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_98,uVar12);
    paVar9 = local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  paVar10 = mesh->mFaces;
  paVar13 = paVar10 + mesh->mNumFaces;
  if ((ulong)mesh->mNumFaces != 0) {
    do {
      if (2 < paVar10->mNumIndices) {
        paVar8 = mesh->mVertices;
        puVar14 = paVar10->mIndices;
        uVar7 = puVar14[paVar10->mNumIndices - 1];
        fVar21 = paVar8[puVar14[1]].x - paVar8[*puVar14].x;
        uVar1 = paVar8[puVar14[1]].y;
        uVar4 = paVar8[puVar14[1]].z;
        fVar18 = paVar8[*puVar14].y;
        fVar23 = (&paVar8[*puVar14].y)[1];
        fVar19 = (float)uVar1 - fVar18;
        fVar20 = (float)uVar4 - fVar23;
        fVar18 = paVar8[uVar7].y - fVar18;
        fVar23 = paVar8[uVar7].z - fVar23;
        fVar24 = paVar8[uVar7].x - paVar8[*puVar14].x;
        fVar22 = fVar19 * fVar23 - fVar18 * fVar20;
        fVar20 = fVar20 * fVar24 - fVar23 * fVar21;
        fVar18 = fVar18 * fVar21 - fVar24 * fVar19;
        fVar23 = 1.0 / SQRT(fVar18 * fVar18 + fVar22 * fVar22 + fVar20 * fVar20);
        uVar12 = 0;
        do {
          uVar7 = paVar10->mIndices[uVar12];
          paVar9[uVar7].x = fVar23 * fVar22;
          paVar9[uVar7].y = fVar23 * fVar20;
          paVar9[uVar7].z = fVar18 * fVar23;
          uVar12 = uVar12 + 1;
        } while (uVar12 < paVar10->mNumIndices);
      }
      paVar10 = paVar10 + 1;
    } while (paVar10 != paVar13);
  }
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    local_c4 = ComputePositionEpsilon(mesh);
    local_c0 = this;
    SGSpatialSort::SGSpatialSort(&local_58);
    paVar10 = mesh->mFaces;
    if (paVar10 != paVar13) {
      puVar14 = *(uint **)local_d0;
      do {
        if (paVar10->mNumIndices != 0) {
          uVar12 = 0;
          do {
            SGSpatialSort::Add(&local_58,mesh->mVertices + paVar10->mIndices[uVar12],
                               paVar10->mIndices[uVar12],*puVar14);
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar10->mNumIndices);
        }
        paVar10 = paVar10 + 1;
        puVar14 = puVar14 + 1;
      } while (paVar10 != paVar13);
    }
    SGSpatialSort::Prepare(&local_58);
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_b8,0x14);
    if ((3.0 <= surface->mMaximumSmoothAngle) || (local_c0->configSpeedFlag != false)) {
      local_d1 = false;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_80,(ulong)mesh->mNumVertices,&local_d1,&local_d2);
      paVar10 = mesh->mFaces;
      if (paVar10 != paVar13) {
        puVar16 = *(uint32_t **)local_d0;
        do {
          if ((ulong)paVar10->mNumIndices != 0) {
            puVar14 = paVar10->mIndices;
            puVar17 = puVar14 + paVar10->mNumIndices;
            do {
              uVar7 = *puVar14;
              if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] >>
                   ((ulong)uVar7 & 0x3f) & 1) == 0) {
                SGSpatialSort::FindPositions
                          (&local_58,mesh->mVertices + uVar7,*puVar16,local_c4,&local_b8,true);
                fVar23 = 0.0;
                fVar19 = 0.0;
                fVar18 = 0.0;
                for (puVar15 = local_b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    puVar15 !=
                    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish; puVar15 = puVar15 + 1) {
                  uVar2 = local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar15].x;
                  uVar5 = local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar15].y;
                  fVar23 = fVar23 + (float)uVar2;
                  fVar19 = fVar19 + (float)uVar5;
                  fVar18 = fVar18 + local_98.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*puVar15].z;
                }
                if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start !=
                    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish) {
                  fVar20 = 1.0 / SQRT(fVar18 * fVar18 + fVar23 * fVar23 + fVar19 * fVar19);
                  puVar11 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    paVar8 = mesh->mNormals;
                    uVar7 = *puVar11;
                    paVar9 = paVar8 + uVar7;
                    paVar9->x = fVar20 * fVar23;
                    paVar9->y = fVar20 * fVar19;
                    paVar8[uVar7].z = fVar18 * fVar20;
                    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[*puVar11 >> 6] =
                         local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [*puVar11 >> 6] | 1L << ((byte)*puVar11 & 0x3f);
                    puVar11 = puVar11 + 1;
                  } while (puVar11 !=
                           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
                }
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar17);
          }
          paVar10 = paVar10 + 1;
          puVar16 = puVar16 + 1;
        } while (paVar10 != paVar13);
      }
      if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
    else {
      fVar18 = cosf(surface->mMaximumSmoothAngle);
      paVar10 = mesh->mFaces;
      if (paVar10 != paVar13) {
        puVar16 = *(uint32_t **)local_d0;
        local_c0 = (LWOImporter *)CONCAT44(local_c0._4_4_,fVar18);
        do {
          local_d0 = paVar10;
          if ((ulong)paVar10->mNumIndices != 0) {
            puVar14 = paVar10->mIndices;
            puVar17 = puVar14 + paVar10->mNumIndices;
            do {
              uVar7 = *puVar14;
              SGSpatialSort::FindPositions
                        (&local_58,mesh->mVertices + uVar7,*puVar16,local_c4,&local_b8,true);
              if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                fVar18 = 0.0;
                fVar23 = 0.0;
                fVar19 = 0.0;
              }
              else {
                fVar18 = 0.0;
                fVar23 = 0.0;
                fVar19 = 0.0;
                puVar11 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar3 = local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar11].x;
                  uVar6 = local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar11].y;
                  fVar20 = local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[*puVar11].z *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].z +
                           (float)uVar3 *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].x +
                           (float)uVar6 *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].y;
                  if (local_c0._0_4_ <= fVar20) {
                    fVar19 = fVar19 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[*puVar11].z;
                  }
                  uVar26 = (uint)(fVar20 < local_c0._0_4_);
                  uVar25 = (int)(uVar26 << 0x1f) >> 0x1f;
                  uVar26 = (int)(uVar26 << 0x1f) >> 0x1f;
                  fVar18 = (float)((uint)fVar18 & uVar25 | ~uVar25 & (uint)((float)uVar3 + fVar18));
                  fVar23 = (float)((uint)fVar23 & uVar26 | ~uVar26 & (uint)((float)uVar6 + fVar23));
                  puVar11 = puVar11 + 1;
                } while (puVar11 !=
                         local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              fVar20 = 1.0 / SQRT(fVar19 * fVar19 + fVar18 * fVar18 + fVar23 * fVar23);
              paVar8 = mesh->mNormals;
              paVar9 = paVar8 + uVar7;
              paVar9->x = fVar20 * fVar18;
              paVar9->y = fVar20 * fVar23;
              paVar8[uVar7].z = fVar19 * fVar20;
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar17);
          }
          paVar10 = local_d0 + 1;
          puVar16 = puVar16 + 1;
        } while (paVar10 != paVar13);
      }
    }
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    SGSpatialSort::~SGSpatialSort(&local_58);
  }
  if (local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
    operator_delete(local_98.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LWOImporter::ComputeNormals(aiMesh* mesh, const std::vector<unsigned int>& smoothingGroups,
    const LWO::Surface& surface)
{
    // Allocate output storage
    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // First generate per-face normals
    aiVector3D* out;
    std::vector<aiVector3D> faceNormals;

    // ... in some cases that's already enough
    if (!surface.mMaximumSmoothAngle)
        out = mesh->mNormals;
    else    {
        faceNormals.resize(mesh->mNumVertices);
        out = &faceNormals[0];
    }

    aiFace* begin = mesh->mFaces, *const end = mesh->mFaces+mesh->mNumFaces;
    for (; begin != end; ++begin)   {
        aiFace& face = *begin;

        if(face.mNumIndices < 3) {
            continue;
        }

        // LWO doc: "the normal is defined as the cross product of the first and last edges"
        aiVector3D* pV1 = mesh->mVertices + face.mIndices[0];
        aiVector3D* pV2 = mesh->mVertices + face.mIndices[1];
        aiVector3D* pV3 = mesh->mVertices + face.mIndices[face.mNumIndices-1];

        aiVector3D vNor = ((*pV2 - *pV1) ^(*pV3 - *pV1)).Normalize();
        for (unsigned int i = 0; i < face.mNumIndices;++i)
            out[face.mIndices[i]] = vNor;
    }
    if (!surface.mMaximumSmoothAngle)return;
    const float posEpsilon = ComputePositionEpsilon(mesh);

    // Now generate the spatial sort tree
    SGSpatialSort sSort;
    std::vector<unsigned int>::const_iterator it = smoothingGroups.begin();
    for( begin =  mesh->mFaces; begin != end; ++begin, ++it)
    {
        aiFace& face = *begin;
        for (unsigned int i = 0; i < face.mNumIndices;++i)
        {
            unsigned int tt = face.mIndices[i];
            sSort.Add(mesh->mVertices[tt],tt,*it);
        }
    }
    // Sort everything - this takes O(nlogn) time
    sSort.Prepare();
    std::vector<unsigned int> poResult;
    poResult.reserve(20);

    // Generate vertex normals. We have O(logn) for the binary lookup, which we need
    // for n elements, thus the EXPECTED complexity is O(nlogn)
    if (surface.mMaximumSmoothAngle < 3.f && !configSpeedFlag)  {
        const float fLimit = std::cos(surface.mMaximumSmoothAngle);

        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    if (v * faceNormals[idx] < fLimit)
                        continue;
                    vNormals += v;
                }
                mesh->mNormals[idx] = vNormals.Normalize();
            }
        }
    }
     // faster code path in case there is no smooth angle
    else    {
        std::vector<bool> vertexDone(mesh->mNumVertices,false);
        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                if (vertexDone[idx])
                    continue;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    vNormals += v;
                }
                vNormals.Normalize();
                for (a =  poResult.begin();a != end;++a)    {
                    mesh->mNormals[*a] = vNormals;
                    vertexDone[*a] = true;
                }
            }
        }
    }
}